

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O3

char * srcdir_path(char *file)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int local_1c;
  
  pcVar2 = getenv("srcdir");
  iVar1 = srcdir_path::curpath;
  if (0x1f < srcdir_path::curpath) {
    srcdir_path_cold_1();
    iVar1 = local_1c;
  }
  srcdir_path::filepath[iVar1][0xfff] = '\0';
  if (pcVar2 == (char *)0x0) {
    snprintf(srcdir_path::filepath[iVar1],0xfff,"%s",file);
  }
  else {
    snprintf(srcdir_path::filepath[iVar1],0xfff,"%s/%s",pcVar2,file);
  }
  lVar3 = (long)srcdir_path::curpath;
  srcdir_path::curpath = srcdir_path::curpath + 1;
  return srcdir_path::filepath[lVar3];
}

Assistant:

const char *srcdir_path(const char *file)
{
#ifdef WIN32
    static char filepath[NUMPATHS][_MAX_PATH];
#else
    static char filepath[NUMPATHS][MAXPATHLEN];
#endif
    static int curpath;
    char *p = getenv("srcdir");
    if(curpath >= NUMPATHS) {
        fprintf(stderr, "srcdir_path ran out of filepath slots.\n");
    }
    assert(curpath < NUMPATHS);
    if(p) {
        /* Ensure the final string is nul-terminated on Windows */
        filepath[curpath][sizeof(filepath[0]) - 1] = 0;
        snprintf(filepath[curpath], sizeof(filepath[0]) - 1, "%s/%s",
                 p, file);
    }
    else {
        /* Ensure the final string is nul-terminated on Windows */
        filepath[curpath][sizeof(filepath[0]) - 1] = 0;
        snprintf(filepath[curpath], sizeof(filepath[0]) - 1, "%s",
                 file);
    }

    return filepath[curpath++];
}